

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

void jpeg_make_d_derived_tbl(j_decompress_ptr cinfo,boolean isDC,int tblno,d_derived_tbl **pdtbl)

{
  int iVar1;
  d_derived_tbl *pdVar2;
  JHUFF_TBL *local_578;
  uint local_56c;
  int sym;
  uint code;
  uint huffcode [257];
  char local_158 [8];
  char huffsize [257];
  int local_4c;
  int local_48;
  int ctr;
  int lookbits;
  int numsymbols;
  int si;
  int l;
  int i;
  int p;
  d_derived_tbl *dtbl;
  JHUFF_TBL *htbl;
  d_derived_tbl **pdtbl_local;
  int tblno_local;
  boolean isDC_local;
  j_decompress_ptr cinfo_local;
  
  if ((tblno < 0) || (3 < tblno)) {
    cinfo->err->msg_code = 0x34;
    (cinfo->err->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (isDC == 0) {
    local_578 = cinfo->ac_huff_tbl_ptrs[tblno];
  }
  else {
    local_578 = cinfo->dc_huff_tbl_ptrs[tblno];
  }
  if (local_578 == (JHUFF_TBL *)0x0) {
    cinfo->err->msg_code = 0x34;
    (cinfo->err->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (*pdtbl == (d_derived_tbl *)0x0) {
    pdVar2 = (d_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x620);
    *pdtbl = pdVar2;
  }
  pdVar2 = *pdtbl;
  pdVar2->pub = local_578;
  l = 0;
  for (numsymbols = 1; iVar1 = l, numsymbols < 0x11; numsymbols = numsymbols + 1) {
    si = (int)local_578->bits[numsymbols];
    if (0x100 < l + si) {
      cinfo->err->msg_code = 9;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    while (si != 0) {
      local_158[l] = (char)numsymbols;
      si = si + -1;
      l = l + 1;
    }
  }
  local_158[l] = '\0';
  local_56c = 0;
  lookbits = (int)local_158[0];
  l = 0;
  while (local_158[l] != '\0') {
    while (local_158[l] == lookbits) {
      (&sym)[l] = local_56c;
      local_56c = local_56c + 1;
      l = l + 1;
    }
    if (1L << ((byte)lookbits & 0x3f) <= (long)(ulong)local_56c) {
      cinfo->err->msg_code = 9;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    local_56c = local_56c << 1;
    lookbits = lookbits + 1;
  }
  l = 0;
  for (numsymbols = 1; numsymbols < 0x11; numsymbols = numsymbols + 1) {
    if (local_578->bits[numsymbols] == '\0') {
      pdVar2->maxcode[numsymbols] = -1;
    }
    else {
      pdVar2->valoffset[numsymbols] = (long)l - (ulong)(uint)(&sym)[l];
      l = (uint)local_578->bits[numsymbols] + l;
      pdVar2->maxcode[numsymbols] = (ulong)(uint)(&sym)[l + -1];
    }
  }
  pdVar2->maxcode[0x11] = 0xfffff;
  memset(pdVar2->look_nbits,0,0x400);
  l = 0;
  for (numsymbols = 1; numsymbols < 9; numsymbols = numsymbols + 1) {
    for (si = 1; si <= (int)(uint)local_578->bits[numsymbols]; si = si + 1) {
      local_48 = (&sym)[l] << (8U - (char)numsymbols & 0x1f);
      for (local_4c = 1 << (8U - (char)numsymbols & 0x1f); 0 < local_4c; local_4c = local_4c + -1) {
        pdVar2->look_nbits[local_48] = numsymbols;
        pdVar2->look_sym[local_48] = local_578->huffval[l];
        local_48 = local_48 + 1;
      }
      l = l + 1;
    }
  }
  if (isDC != 0) {
    for (si = 0; si < iVar1; si = si + 1) {
      if (0xf < local_578->huffval[si]) {
        cinfo->err->msg_code = 9;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
jpeg_make_d_derived_tbl (j_decompress_ptr cinfo, boolean isDC, int tblno,
			 d_derived_tbl ** pdtbl)
{
  JHUFF_TBL *htbl;
  d_derived_tbl *dtbl;
  int p, i, l, si, numsymbols;
  int lookbits, ctr;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (d_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(d_derived_tbl));
  dtbl = *pdtbl;
  dtbl->pub = htbl;		/* fill in back link */
  
  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int) htbl->bits[l];
    if (i < 0 || p + i > 256)	/* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char) l;
  }
  huffsize[p] = 0;
  numsymbols = p;
  
  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */
  
  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int) huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((INT32) code) >= (((INT32) 1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure F.15: generate decoding tables for bit-sequential decoding */

  p = 0;
  for (l = 1; l <= 16; l++) {
    if (htbl->bits[l]) {
      /* valoffset[l] = huffval[] index of 1st symbol of code length l,
       * minus the minimum code of length l
       */
      dtbl->valoffset[l] = (INT32) p - (INT32) huffcode[p];
      p += htbl->bits[l];
      dtbl->maxcode[l] = huffcode[p-1]; /* maximum code of length l */
    } else {
      dtbl->maxcode[l] = -1;	/* -1 if no codes of this length */
    }
  }
  dtbl->maxcode[17] = 0xFFFFFL; /* ensures jpeg_huff_decode terminates */

  /* Compute lookahead tables to speed up decoding.
   * First we set all the table entries to 0, indicating "too long";
   * then we iterate through the Huffman codes that are short enough and
   * fill in all the entries that correspond to bit sequences starting
   * with that code.
   */

  MEMZERO(dtbl->look_nbits, SIZEOF(dtbl->look_nbits));

  p = 0;
  for (l = 1; l <= HUFF_LOOKAHEAD; l++) {
    for (i = 1; i <= (int) htbl->bits[l]; i++, p++) {
      /* l = current code's length, p = its index in huffcode[] & huffval[]. */
      /* Generate left-justified code followed by all possible bit sequences */
      lookbits = huffcode[p] << (HUFF_LOOKAHEAD-l);
      for (ctr = 1 << (HUFF_LOOKAHEAD-l); ctr > 0; ctr--) {
	dtbl->look_nbits[lookbits] = l;
	dtbl->look_sym[lookbits] = htbl->huffval[p];
	lookbits++;
      }
    }
  }

  /* Validate symbols as being reasonable.
   * For AC tables, we make no check, but accept all byte values 0..255.
   * For DC tables, we require the symbols to be in range 0..15.
   * (Tighter bounds could be applied depending on the data depth and mode,
   * but this is sufficient to ensure safe decoding.)
   */
  if (isDC) {
    for (i = 0; i < numsymbols; i++) {
      int sym = htbl->huffval[i];
      if (sym < 0 || sym > 15)
	ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    }
  }
}